

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_date.cpp
# Opt level: O1

void duckdb::ExecuteMakeTime<long>(DataChunk *input,ExpressionState *state,Vector *result)

{
  reference a;
  reference b;
  reference c;
  
  a = vector<duckdb::Vector,_true>::operator[](&input->data,0);
  b = vector<duckdb::Vector,_true>::operator[](&input->data,1);
  c = vector<duckdb::Vector,_true>::operator[](&input->data,2);
  TernaryExecutor::
  ExecuteGeneric<long,long,double,duckdb::dtime_t,duckdb::TernaryLambdaWrapper,duckdb::dtime_t(*)(long,long,double)>
            (a,b,c,result,input->count,MakeTimeOperator::Operation<long,long,double,duckdb::dtime_t>
            );
  return;
}

Assistant:

static void ExecuteMakeTime(DataChunk &input, ExpressionState &state, Vector &result) {
	D_ASSERT(input.ColumnCount() == 3);
	auto &yyyy = input.data[0];
	auto &mm = input.data[1];
	auto &dd = input.data[2];

	TernaryExecutor::Execute<T, T, double, dtime_t>(yyyy, mm, dd, result, input.size(),
	                                                MakeTimeOperator::Operation<T, T, double, dtime_t>);
}